

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O1

void __thiscall
rigtorp::mpmc::Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_>::Queue
          (Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_> *this,
          size_t capacity,allocator<rigtorp::mpmc::Slot<unsigned_long>_> *allocator)

{
  Slot<unsigned_long> *pSVar1;
  long lVar2;
  invalid_argument *this_00;
  undefined8 *puVar3;
  ulong uVar4;
  
  this->capacity_ = capacity;
  (this->head_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->tail_).super___atomic_base<unsigned_long>._M_i = 0;
  if (capacity == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"capacity < 1");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pSVar1 = __gnu_cxx::new_allocator<rigtorp::mpmc::Slot<unsigned_long>_>::allocate
                     ((new_allocator<rigtorp::mpmc::Slot<unsigned_long>_> *)this,capacity + 1,
                      (void *)0x0);
  this->slots_ = pSVar1;
  if (((ulong)pSVar1 & 0x3f) == 0) {
    if (this->capacity_ != 0) {
      lVar2 = 0;
      uVar4 = 0;
      do {
        pSVar1 = this->slots_;
        uVar4 = uVar4 + 1;
        *(undefined8 *)(&pSVar1->field_0x30 + lVar2) = 0;
        *(undefined8 *)((long)(&pSVar1->field_0x30 + lVar2) + 8) = 0;
        *(undefined8 *)(&pSVar1->field_0x20 + lVar2) = 0;
        *(undefined8 *)((long)(&pSVar1->field_0x20 + lVar2) + 8) = 0;
        *(undefined8 *)(&pSVar1->field_0x10 + lVar2) = 0;
        *(undefined8 *)((long)(&pSVar1->field_0x10 + lVar2) + 8) = 0;
        puVar3 = (undefined8 *)
                 ((long)&(pSVar1->turn).super___atomic_base<unsigned_long>._M_i + lVar2);
        *puVar3 = 0;
        puVar3[1] = 0;
        lVar2 = lVar2 + 0x40;
      } while (uVar4 < this->capacity_);
    }
    return;
  }
  operator_delete(pSVar1,this->capacity_ * 0x40 + 0x40,0x40);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = operator_new;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

explicit Queue(const size_t capacity,
                 const Allocator &allocator = Allocator())
      : capacity_(capacity), allocator_(allocator), head_(0), tail_(0) {
    if (capacity_ < 1) {
      throw std::invalid_argument("capacity < 1");
    }
    // Allocate one extra slot to prevent false sharing on the last slot
    slots_ = allocator_.allocate(capacity_ + 1);
    // Allocators are not required to honor alignment for over-aligned types
    // (see http://eel.is/c++draft/allocator.requirements#10) so we verify
    // alignment here
    if (reinterpret_cast<size_t>(slots_) % alignof(Slot<T>) != 0) {
      allocator_.deallocate(slots_, capacity_ + 1);
      throw std::bad_alloc();
    }
    for (size_t i = 0; i < capacity_; ++i) {
      new (&slots_[i]) Slot<T>();
    }
    static_assert(
        alignof(Slot<T>) == hardwareInterferenceSize,
        "Slot must be aligned to cache line boundary to prevent false sharing");
    static_assert(sizeof(Slot<T>) % hardwareInterferenceSize == 0,
                  "Slot size must be a multiple of cache line size to prevent "
                  "false sharing between adjacent slots");
    static_assert(sizeof(Queue) % hardwareInterferenceSize == 0,
                  "Queue size must be a multiple of cache line size to "
                  "prevent false sharing between adjacent queues");
    static_assert(
        offsetof(Queue, tail_) - offsetof(Queue, head_) ==
            static_cast<std::ptrdiff_t>(hardwareInterferenceSize),
        "head and tail must be a cache line apart to prevent false sharing");
  }